

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcold.c
# Opt level: O3

int ffr8fi8(double *input,long ntodo,double scale,double zero,LONGLONG *output,int *status)

{
  long lVar1;
  ulong uVar2;
  LONGLONG LVar3;
  double dVar4;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 9.223372036854776e+18)) || (NAN(zero))) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      if (0 < ntodo) {
        lVar1 = 0;
        do {
          dVar4 = (input[lVar1] - zero) / scale;
          if (-9.223372036854776e+18 <= dVar4) {
            if (dVar4 <= 9.223372036854776e+18) {
              if (0.0 <= dVar4) {
                dVar4 = dVar4 + 0.5;
              }
              else {
                dVar4 = dVar4 + -0.5;
              }
              LVar3 = (LONGLONG)dVar4;
            }
            else {
              *status = -0xb;
              LVar3 = 0x7fffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            LVar3 = -0x8000000000000000;
          }
          output[lVar1] = LVar3;
          lVar1 = lVar1 + 1;
        } while (ntodo != lVar1);
      }
    }
    else if (0 < ntodo) {
      lVar1 = 0;
      do {
        dVar4 = input[lVar1];
        if (-9.223372036854776e+18 <= dVar4) {
          if (dVar4 <= 9.223372036854776e+18) {
            LVar3 = (LONGLONG)dVar4;
          }
          else {
            *status = -0xb;
            LVar3 = 0x7fffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          LVar3 = -0x8000000000000000;
        }
        output[lVar1] = LVar3;
        lVar1 = lVar1 + 1;
      } while (ntodo != lVar1);
    }
  }
  else if (0 < ntodo) {
    lVar1 = 0;
    do {
      dVar4 = input[lVar1];
      if (-0.49 <= dVar4) {
        if (dVar4 <= 1.8446744073709552e+19) {
          uVar2 = (long)dVar4 ^ 0x8000000000000000;
        }
        else {
          *status = -0xb;
          uVar2 = 0x7fffffffffffffff;
        }
      }
      else {
        *status = -0xb;
        uVar2 = 0x8000000000000000;
      }
      output[lVar1] = uVar2;
      lVar1 = lVar1 + 1;
    } while (ntodo != lVar1);
  }
  return *status;
}

Assistant:

int ffr8fi8(double *input,     /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            LONGLONG *output,      /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero ==  9223372036854775808.)
    {       
        /* Writing to unsigned long long column. Input values must not be negative */
        /* Instead of subtracting 9223372036854775808, it is more efficient */
        /* and more precise to just flip the sign bit with the XOR operator */

        for (ii = 0; ii < ntodo; ii++) {
            if (input[ii] < -0.49) {
              *status = OVERFLOW_ERR;
              output[ii] = LONGLONG_MIN;
            }
	    else if (input[ii] > 2.* DLONGLONG_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MAX;
            } else {
              output[ii] =  ((LONGLONG) input[ii]) ^ 0x8000000000000000;
            }
        }
    }
    else if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] < DLONGLONG_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MIN;
            }
            else if (input[ii] > DLONGLONG_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MAX;
            }
            else
                output[ii] = (LONGLONG) input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DLONGLONG_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MIN;
            }
            else if (dvalue > DLONGLONG_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (LONGLONG) (dvalue + .5);
                else
                    output[ii] = (LONGLONG) (dvalue - .5);
            }
        }
    }
    return(*status);
}